

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O2

bool __thiscall
Centaurus::ATNMachine<wchar_t>::verify_invocations
          (ATNMachine<wchar_t> *this,
          unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>_>
          *network)

{
  pointer pAVar1;
  const_iterator cVar2;
  ATNNode<wchar_t> *node;
  pointer pAVar3;
  
  pAVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar3 = (this->m_nodes).
                super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar3 != pAVar1; pAVar3 = pAVar3 + 1) {
    if (pAVar3->m_type == Nonterminal) {
      cVar2 = std::
              _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&network->_M_h,&pAVar3->m_invoke);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<wchar_t>_>,_true>
          ._M_cur == (__node_type *)0x0) break;
    }
  }
  return pAVar3 == pAVar1;
}

Assistant:

bool ATNMachine<TCHAR>::verify_invocations(const std::unordered_map<Identifier, ATNMachine<TCHAR> >& network) const
{
	for (const auto& node : m_nodes)
	{
		if (node.type() == ATNNodeType::Nonterminal)
		{
			if (network.find(node.get_invoke()) == network.cend())
			{
				return false;
			}
		}
	}

	return true;
}